

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

Territory __thiscall QLocalePrivate::codeToTerritory(QLocalePrivate *this,QStringView code)

{
  char32_t cVar1;
  char32_t cVar2;
  char32_t cVar3;
  long lVar4;
  uint uVar5;
  ushort *puVar6;
  
  puVar6 = (ushort *)code.m_size;
  uVar5 = 0;
  if ((undefined1 *)0xfffffffffffffffd < &this[-1].field_0x1c) {
    cVar1 = QChar::toUpper((uint)*puVar6);
    cVar2 = QChar::toUpper((uint)puVar6[1]);
    if ((QLocalePrivate *)0x2 < this) {
      cVar3 = QChar::toUpper((uint)puVar6[2]);
      uVar5 = cVar3 & 0xffff;
    }
    for (lVar4 = 0; "ZZ"[lVar4] != 0; lVar4 = lVar4 + 3) {
      if ((((ushort)cVar1 == (ushort)"ZZ"[lVar4]) && ((ushort)cVar2 == (ushort)"ZZ"[lVar4 + 1])) &&
         (uVar5 == "ZZ"[lVar4 + 2])) {
        return (Territory)(lVar4 / 3);
      }
    }
  }
  return AnyCountry;
}

Assistant:

QLocale::Territory QLocalePrivate::codeToTerritory(QStringView code) noexcept
{
    const auto len = code.size();
    if (len != 2 && len != 3)
        return QLocale::AnyTerritory;

    char16_t uc1 = code[0].toUpper().unicode();
    char16_t uc2 = code[1].toUpper().unicode();
    char16_t uc3 = len > 2 ? code[2].toUpper().unicode() : 0;

    const unsigned char *c = territory_code_list;
    for (; *c != 0; c += 3) {
        if (uc1 == c[0] && uc2 == c[1] && uc3 == c[2])
            return QLocale::Territory((c - territory_code_list)/3);
    }

    return QLocale::AnyTerritory;
}